

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

bb_insn_t_conflict get_def(gen_ctx_t gen_ctx,MIR_reg_t reg,bb_t_conflict bb)

{
  void **ppvVar1;
  uint uVar2;
  MIR_context_t ctx;
  MIR_context_t pMVar3;
  VARR_bb_insn_t *pVVar4;
  bitmap_t pVVar5;
  gen_ctx_t pgVar6;
  VARR_char *pVVar7;
  bb_t_conflict bb_00;
  gen_ctx *pgVar8;
  def_tab_el_t el_00;
  def_tab_el_t el_01;
  int iVar9;
  MIR_type_t MVar10;
  in_edge_t_conflict peVar11;
  undefined1 *puVar12;
  MIR_item_t pMVar13;
  MIR_insn_t_conflict pMVar14;
  ulong uVar15;
  bb_insn_t_conflict *ppbVar16;
  bitmap_el_t *pbVar17;
  char *pcVar18;
  uint *puVar19;
  c2mir_ctx *pcVar20;
  bb_insn_t_conflict pbVar21;
  uint uVar22;
  long lVar23;
  uint *puVar24;
  uint uVar25;
  uint var;
  in_edge_t peVar26;
  def_tab_el_t *res;
  uint uVar27;
  gen_ctx *pgVar28;
  MIR_insn_code_t code;
  gen_ctx_t ctx_00;
  gen_ctx_t htab;
  gen_ctx_t pgVar29;
  size_t sVar30;
  char *pcVar31;
  gen_ctx *__n;
  def_tab_el_t *pdVar32;
  uint uVar33;
  MIR_context_t pMVar34;
  def_tab_el_t el;
  def_tab_el_t tab_el;
  undefined8 uVar35;
  undefined8 uStack_d0;
  undefined4 uStack_bc;
  bb_insn_t_conflict local_b8;
  def_tab_el_t local_b0;
  MIR_context_t pMStack_98;
  MIR_module_t pMStack_90;
  MIR_item_t local_88;
  FILE *pFStack_80;
  int iStack_78;
  undefined4 uStack_74;
  MIR_item_t pMStack_70;
  undefined1 local_68 [16];
  MIR_item_t pMStack_58;
  FILE *pFStack_50;
  int iStack_48;
  undefined4 uStack_44;
  MIR_item_t pMStack_40;
  
  ctx_00 = (gen_ctx_t)gen_ctx->ctx;
  uVar35 = CONCAT44(uStack_bc,reg);
  el_00._8_8_ = uVar35;
  el_00.bb = bb;
  el_00.def = local_b8;
  iVar9 = HTAB_def_tab_el_t_do(gen_ctx->ssa_ctx->def_tab,el_00,HTAB_FIND,&local_b0);
  if (iVar9 != 0) {
    return local_b0.def;
  }
  peVar11 = (bb->in_edges).head;
  if (peVar11 != (in_edge_t_conflict)0x0) {
    lVar23 = 1;
    peVar26 = peVar11;
    do {
      peVar26 = (peVar26->in_link).next;
      lVar23 = lVar23 + -1;
    } while (peVar26 != (in_edge_t)0x0);
    if (lVar23 == 0) {
      if (peVar11->src->index != 0) {
        pbVar21 = get_def(gen_ctx,reg,peVar11->src);
        return pbVar21;
      }
      pbVar21 = get_fake_insn(gen_ctx,gen_ctx->ssa_ctx->arg_bb_insns,reg);
      return pbVar21;
    }
  }
  htab = (gen_ctx_t)local_68;
  _MIR_new_var_op((MIR_context_t)ctx_00,reg);
  iStack_78 = iStack_48;
  uStack_74 = uStack_44;
  pMStack_70 = pMStack_40;
  pMStack_98 = (MIR_context_t)local_68._0_8_;
  pMStack_90 = (MIR_module_t)local_68._8_8_;
  local_88 = pMStack_58;
  pFStack_80 = pFStack_50;
  pMVar34 = (MIR_context_t)0x1;
  for (peVar11 = (bb->in_edges).head; peVar11 != (in_edge_t_conflict)0x0;
      peVar11 = (peVar11->in_link).next) {
    pMVar34 = (MIR_context_t)((long)&pMVar34->gen_ctx + 1);
  }
  __n = (gen_ctx *)gen_ctx->temp_ops;
  if ((__n == (gen_ctx *)0x0) || (__n->curr_func_item == (MIR_item_t)0x0)) {
LAB_00160966:
    get_def_cold_4();
  }
  else {
    ctx = gen_ctx->ctx;
    __n->ctx = (MIR_context_t)0x0;
    do {
      if (pMVar34 <= __n->ctx) goto LAB_0016084b;
      htab = (gen_ctx_t)__n->curr_func_item;
      if (htab == (gen_ctx_t)0x0) {
        get_def_cold_3();
        goto LAB_00160966;
      }
      puVar12 = (undefined1 *)((long)&__n->ctx->gen_ctx + 1);
      if (*(undefined1 **)&__n->optimize_level < puVar12) {
        ctx_00 = (gen_ctx_t)((long)(puVar12 + ((ulong)puVar12 >> 1)) * 0x30);
        pMVar13 = (MIR_item_t)realloc(htab,(size_t)ctx_00);
        __n->curr_func_item = pMVar13;
        *(undefined1 **)&__n->optimize_level = puVar12 + ((ulong)puVar12 >> 1);
      }
      pMVar3 = __n->ctx;
      pMVar13 = __n->curr_func_item;
      __n->ctx = (MIR_context_t)((long)&pMVar3->gen_ctx + 1);
      (&pMVar13->item_link)[(long)pMVar3 * 3].prev = local_88;
      (&pMVar13->item_link)[(long)pMVar3 * 3].next = (MIR_item_t)pFStack_80;
      *(undefined8 *)(&pMVar13->item_type + (long)pMVar3 * 0xc) = _iStack_78;
      (&pMVar13->ref_def)[(long)pMVar3 * 6] = pMStack_70;
      ppvVar1 = &pMVar13->data + (long)pMVar3 * 6;
      *ppvVar1 = pMStack_98;
      ppvVar1[1] = pMStack_90;
      ((DLIST_LINK_MIR_item_t *)(ppvVar1 + 2))->prev = local_88;
      ppvVar1[3] = pFStack_80;
      __n = (gen_ctx *)gen_ctx->temp_ops;
    } while (__n != (gen_ctx *)0x0);
    get_def_cold_2();
LAB_0016084b:
    pMVar14 = MIR_new_insn_arr(ctx,MIR_PHI,(size_t)pMVar34,(MIR_op_t *)__n->curr_func_item);
    ctx_00 = (gen_ctx_t)((bb->bb_insns).head)->insn;
    if (*(int *)&ctx_00->debug_file == 0xb4) {
      gen_add_insn_after(gen_ctx,(MIR_insn_t)ctx_00,pMVar14);
    }
    else {
      gen_add_insn_before(gen_ctx,(MIR_insn_t)ctx_00,pMVar14);
    }
    pbVar21 = (bb_insn_t_conflict)pMVar14->data;
    pMVar14->ops[0].data = pbVar21;
    pVVar4 = gen_ctx->ssa_ctx->phis;
    htab = (gen_ctx_t)pVVar4->varr;
    if (htab != (gen_ctx_t)0x0) {
      uVar15 = pVVar4->els_num + 1;
      if (pVVar4->size < uVar15) {
        sVar30 = (uVar15 >> 1) + uVar15;
        ppbVar16 = (bb_insn_t_conflict *)realloc(htab,sVar30 * 8);
        pVVar4->varr = ppbVar16;
        pVVar4->size = sVar30;
      }
      sVar30 = pVVar4->els_num;
      pVVar4->els_num = sVar30 + 1;
      pVVar4->varr[sVar30] = pbVar21;
      el_01._12_4_ = uStack_bc;
      el_01.reg = reg;
      el_01.bb = bb;
      el_01.def = pbVar21;
      HTAB_def_tab_el_t_do(gen_ctx->ssa_ctx->def_tab,el_01,HTAB_INSERT,&local_b0);
      return pbVar21;
    }
  }
  get_def_cold_1();
  pVVar5 = htab->tied_regs;
  pgVar29 = htab;
  if (pVVar5 == (bitmap_t)0x0) {
    HTAB_def_tab_el_t_do_cold_8();
    htab = ctx_00;
LAB_00160d14:
    HTAB_def_tab_el_t_do_cold_7();
LAB_00160d19:
    HTAB_def_tab_el_t_do_cold_2();
LAB_00160d1e:
    HTAB_def_tab_el_t_do_cold_1();
LAB_00160d23:
    HTAB_def_tab_el_t_do_cold_4();
LAB_00160d28:
    HTAB_def_tab_el_t_do_cold_6();
LAB_00160d2d:
    HTAB_def_tab_el_t_do_cold_5();
  }
  else {
    if (*(VARR_char **)&htab->addr_insn_p == (VARR_char *)0x0) goto LAB_00160d14;
    __n = (gen_ctx *)pVVar5->els_num;
    pgVar6 = (gen_ctx_t)((DLIST_LINK_MIR_item_t *)&htab->curr_func_item)->prev;
    uVar22 = (int)ctx_00 - 1;
    if ((1 < uVar22) ||
       (iVar9 = (int)(*(VARR_char **)&htab->addr_insn_p)->els_num, htab->optimize_level != iVar9)) {
LAB_00160b1a:
      pgVar29 = pgVar6;
      iVar9 = (*(code *)htab->debug_file)();
      uVar25 = iVar9 + (uint)(iVar9 == 0);
      if (htab->tied_regs == (bitmap_t)0x0) goto LAB_00160d19;
      if (*(VARR_char **)&htab->addr_insn_p != (VARR_char *)0x0) {
        pbVar17 = htab->tied_regs->varr;
        pcVar18 = (*(VARR_char **)&htab->addr_insn_p)->varr;
        puVar24 = (uint *)0x0;
        uVar33 = uVar25;
        uVar27 = uVar25;
        do {
          uVar27 = uVar27 & (int)__n - 1U;
          puVar19 = (uint *)((long)pbVar17 + (ulong)uVar27 * 4);
          uVar2 = *puVar19;
          if ((ulong)uVar2 != 0xfffffffe) {
            if (uVar2 == 0xffffffff) {
              uVar27 = 0;
              if (1 < uVar22) goto LAB_00160cfd;
              *(int *)&htab->ctx = *(int *)&htab->ctx + 1;
              if (puVar24 != (uint *)0x0) {
                puVar19 = puVar24;
              }
              lVar23 = (ulong)htab->optimize_level * 0x20;
              *(uint *)(pcVar18 + lVar23) = uVar25;
              pcVar31 = &stack0xffffffffffffff20;
              *(undefined8 *)(pcVar18 + lVar23 + 8) = uVar35;
              *(bb_insn_t_conflict *)(pcVar18 + lVar23 + 8 + 8) = local_b8;
              *(undefined8 *)(pcVar18 + lVar23 + 0x18) = uStack_d0;
              uVar22 = htab->optimize_level;
              htab->optimize_level = uVar22 + 1;
              *puVar19 = uVar22;
              uVar27 = 0;
              goto LAB_00160cea;
            }
            lVar23 = (ulong)uVar2 * 0x20;
            puVar19 = puVar24;
            if ((*(uint *)(pcVar18 + lVar23) == uVar25) &&
               (iVar9 = (*(code *)*(VARR_size_t **)&htab->debug_level)(pgVar6), iVar9 != 0)) {
              pcVar31 = pcVar18 + lVar23 + 8;
              uVar27 = 1;
              if ((int)ctx_00 == 2) {
                if ((MIR_item_t)htab->to_free != (MIR_item_t)0x0) {
                  (*(code *)htab->to_free)(pgVar6);
                }
                *(undefined8 *)(pcVar18 + lVar23 + 0x18) = uStack_d0;
                *(undefined8 *)pcVar31 = uVar35;
                *(bb_insn_t_conflict *)(pcVar18 + lVar23 + 0x10) = local_b8;
              }
LAB_00160cea:
              res->def = *(bb_insn_t_conflict *)(pcVar31 + 0x10);
              uVar35 = *(undefined8 *)(pcVar31 + 8);
              res->bb = *(bb_t_conflict *)pcVar31;
              *(undefined8 *)&res->reg = uVar35;
LAB_00160cfd:
              return (bb_insn_t_conflict)(ulong)uVar27;
            }
          }
          uVar33 = uVar33 >> 0xb;
          uVar27 = uVar33 + 1 + uVar27 * 5;
          *(int *)&htab->field_0xc = *(int *)&htab->field_0xc + 1;
          puVar24 = puVar19;
        } while( true );
      }
      goto LAB_00160d1e;
    }
    pgVar29 = (gen_ctx_t)pVVar5->varr;
    if (pgVar29 == (gen_ctx_t)0x0) goto LAB_00160d28;
    uVar25 = (uint)__n * 2;
    uVar15 = (ulong)uVar25;
    if (pVVar5->size != uVar15) {
      pbVar17 = (bitmap_el_t *)realloc(pgVar29,uVar15 * 4);
      pVVar5->varr = pbVar17;
    }
    pVVar5->size = uVar15;
    pVVar5->els_num = uVar15;
    if (htab->tied_regs == (bitmap_t)0x0) goto LAB_00160d2d;
    if (uVar25 != 0) {
      pgVar29 = (gen_ctx_t)htab->tied_regs->varr;
      __n = (gen_ctx *)((ulong)((uint)__n & 0x7fffffff) << 3);
      memset(pgVar29,0xff,(size_t)__n);
    }
    pVVar7 = *(VARR_char **)&htab->addr_insn_p;
    if ((pVVar7 == (VARR_char *)0x0) ||
       (pgVar29 = (gen_ctx_t)pVVar7->varr, pgVar29 == (gen_ctx_t)0x0)) goto LAB_00160d23;
    uVar15 = (ulong)(uint)(iVar9 * 2);
    if (pVVar7->size != uVar15) {
      pcVar18 = (char *)realloc(pgVar29,uVar15 << 5);
      pVVar7->varr = pcVar18;
    }
    pVVar7->size = uVar15;
    pVVar7->els_num = uVar15;
    if (*(VARR_char **)&htab->addr_insn_p != (VARR_char *)0x0) {
      pcVar18 = (*(VARR_char **)&htab->addr_insn_p)->varr;
      uVar27 = *(uint *)((long)&htab->ctx + 4);
      uVar33 = htab->optimize_level;
      *(undefined4 *)&htab->ctx = 0;
      htab->optimize_level = 0;
      *(undefined4 *)((long)&htab->ctx + 4) = 0;
      if (uVar27 < uVar33) {
        lVar23 = (ulong)uVar33 - (ulong)uVar27;
        pdVar32 = (def_tab_el_t *)(pcVar18 + (ulong)uVar27 * 0x20 + 8);
        do {
          if (*(int *)&pdVar32[-1].def != 0) {
            HTAB_def_tab_el_t_do((HTAB_def_tab_el_t *)htab,*pdVar32,HTAB_INSERT,res);
            (*(code *)*(VARR_size_t **)&htab->debug_level)(pgVar6);
          }
          pdVar32 = (def_tab_el_t *)&pdVar32[1].reg;
          lVar23 = lVar23 + -1;
        } while (lVar23 != 0);
      }
      __n = (gen_ctx *)(ulong)uVar25;
      goto LAB_00160b1a;
    }
  }
  HTAB_def_tab_el_t_do_cold_3();
  bb_00 = (pgVar29->curr_cfg->bbs).head;
  if (bb_00->index != 0) {
LAB_00160ea5:
    __assert_fail("bb->index == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x897,"bb_insn_t get_fake_insn(gen_ctx_t, VARR_bb_insn_t *, MIR_reg_t)");
  }
  pgVar28 = (gen_ctx *)(ulong)var;
  pMVar34 = pgVar29->ctx;
  _MIR_new_var_op(pMVar34,var);
  while (htab != (gen_ctx_t)0x0) {
    __n = pgVar28;
    if (pgVar28 < (gen_ctx *)htab->ctx) goto LAB_00160dde;
    if (htab->curr_func_item == (MIR_item_t)0x0) {
      get_fake_insn_cold_1();
      goto LAB_00160ea5;
    }
    pcVar20 = (c2mir_ctx *)((long)&((gen_ctx *)htab->ctx)->ctx + 1);
    if (*(c2mir_ctx **)&htab->optimize_level < pcVar20) {
      pMVar13 = (MIR_item_t)
                realloc(htab->curr_func_item,(long)(pcVar20 + ((ulong)pcVar20 >> 1)) * 8);
      htab->curr_func_item = pMVar13;
      *(c2mir_ctx **)&htab->optimize_level = pcVar20 + ((ulong)pcVar20 >> 1);
    }
    pgVar8 = (gen_ctx *)htab->ctx;
    htab->ctx = (MIR_context_t)((long)&pgVar8->ctx + 1);
    (&htab->curr_func_item->data)[(long)pgVar8] = (void *)0x0;
  }
  get_fake_insn_cold_4();
LAB_00160dde:
  if (htab->curr_func_item == (MIR_item_t)0x0) {
    get_fake_insn_cold_3();
  }
  else {
    pbVar21 = (bb_insn_t_conflict)(&htab->curr_func_item->data)[(long)__n];
    if (pbVar21 != (bb_insn_t_conflict)0x0) {
      return pbVar21;
    }
    if (var < 0x22) goto LAB_00160ece;
    MVar10 = MIR_reg_type(pMVar34,var - 0x21,(pgVar29->curr_func_item->u).func);
    if (MVar10 == MIR_T_F) {
      code = MIR_FMOV;
    }
    else if (MVar10 == MIR_T_D) {
      code = MIR_DMOV;
    }
    else {
      code = (uint)(MVar10 == MIR_T_LD) * 3;
    }
    pMVar14 = MIR_new_insn(pMVar34,code);
    pbVar21 = create_bb_insn(pgVar29,pMVar14,bb_00);
    if ((htab->curr_func_item != (MIR_item_t)0x0) && (__n < (gen_ctx *)htab->ctx)) {
      (&htab->curr_func_item->data)[(long)__n] = pbVar21;
      return pbVar21;
    }
  }
  get_fake_insn_cold_2();
LAB_00160ece:
  __assert_fail("reg > ST1_HARD_REG",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x89b,"bb_insn_t get_fake_insn(gen_ctx_t, VARR_bb_insn_t *, MIR_reg_t)");
}

Assistant:

static bb_insn_t get_def (gen_ctx_t gen_ctx, MIR_reg_t reg, bb_t bb) {
  MIR_context_t ctx = gen_ctx->ctx;
  bb_t src;
  bb_insn_t def;
  def_tab_el_t el, tab_el;
  MIR_op_t op;

  el.bb = bb;
  el.reg = reg;
  if (HTAB_DO (def_tab_el_t, def_tab, el, HTAB_FIND, tab_el)) return tab_el.def;
  if (DLIST_LENGTH (in_edge_t, bb->in_edges) == 1) {
    if ((src = DLIST_HEAD (in_edge_t, bb->in_edges)->src)->index == 0) { /* start bb: args */
      return get_fake_insn (gen_ctx, arg_bb_insns, reg);
    }
    return get_def (gen_ctx, reg, DLIST_HEAD (in_edge_t, bb->in_edges)->src);
  }
  op = _MIR_new_var_op (ctx, reg);
  el.def = def = create_phi (gen_ctx, bb, op);
  HTAB_DO (def_tab_el_t, def_tab, el, HTAB_INSERT, tab_el);
  return el.def;
}